

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zp_field_shared.h
# Opt level: O2

void Gudhi::persistence_fields::Shared_Zp_field_element<unsigned_int,_void>::initialize
               (Characteristic characteristic)

{
  pointer puVar1;
  invalid_argument *this;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  
  if (characteristic < 2) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this,"Characteristic must be strictly positive and a prime number.");
LAB_0010efb1:
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&inverse_,(ulong)characteristic);
  puVar1 = inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *inverse_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  uVar3 = 1;
  do {
    if (uVar3 == characteristic) {
      characteristic_ = characteristic;
      return;
    }
    uVar2 = uVar3 & 0xffffffff;
    uVar4 = 1;
    while( true ) {
      if ((int)(uVar2 % (ulong)characteristic) == 1) break;
      if (characteristic == (Characteristic)uVar2) {
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this,"Characteristic must be a prime number.");
        goto LAB_0010efb1;
      }
      uVar4 = uVar4 + 1;
      uVar2 = (ulong)((Characteristic)uVar2 + (int)uVar3);
    }
    puVar1[uVar3] = uVar4;
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

static void initialize(Characteristic characteristic) {
    if (characteristic <= 1)
      throw std::invalid_argument("Characteristic must be strictly positive and a prime number.");

    inverse_.resize(characteristic);
    inverse_[0] = 0;
    for (Element i = 1; i < characteristic; ++i) {
      Element inv = 1;
      Element mult = inv * i;
      while ((mult % characteristic) != 1) {
        ++inv;
        if (mult == characteristic) throw std::invalid_argument("Characteristic must be a prime number.");
        mult = inv * i;
      }
      inverse_[i] = inv;
    }

    characteristic_ = characteristic;
  }